

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_full_path.cpp
# Opt level: O2

void test_trace(void)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  SpyingSerial::clear(&Serial);
  std::operator<<((ostream *)&Serial.field_0x10,
                  "/workspace/llm4binary/github/license_c_cmakelists/bblanchon[P]ArduinoTrace/extras/test/test_full_path.cpp"
                 );
  std::operator<<((ostream *)&Serial.field_0x10,":12: ");
  SpyingSerial::println<char[18]>(&Serial,(char (*) [18])"void test_trace()");
  SpyingSerial::flush(&Serial);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             ".+test_full_path.cpp:\\d+: void test_trace\\(\\)\r\nflush\\(\\)\r\n",&local_51);
  ASSERT_RE(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void test_trace() {
  Serial.clear();
  TRACE();
  ASSERT_RE(Serial.log(),
            ".+test_full_path.cpp:\\d+: void test_trace\\(\\)\r\n"
            "flush\\(\\)\r\n");
}